

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AnyDistributionEdgeCalculator.cpp
# Opt level: O3

int __thiscall
AnyDistributionEdgeCalculator::computeAllowableInsertSizeDiff(AnyDistributionEdgeCalculator *this)

{
  long lVar1;
  double *pdVar2;
  pointer pdVar3;
  uint uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  int iVar8;
  pointer pdVar9;
  ulong uVar10;
  bool bVar11;
  double dVar12;
  vector<double,_std::allocator<double>_> diff_dist;
  allocator_type local_31;
  value_type_conflict4 local_30;
  vector<double,_std::allocator<double>_> local_28;
  
  local_30 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&local_28,
             (long)(this->insert_size_dist->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->insert_size_dist->super__Vector_base<double,_std::allocator<double>_>).
                   _M_impl.super__Vector_impl_data._M_start >> 2,&local_30,&local_31);
  pdVar3 = (this->insert_size_dist->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar5 = (long)(this->insert_size_dist->super__Vector_base<double,_std::allocator<double>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pdVar3;
  if (lVar5 != 0) {
    uVar6 = lVar5 >> 3;
    pdVar9 = pdVar3;
    uVar7 = 0;
    do {
      *local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
       _M_start = pdVar3[uVar7] * pdVar3[uVar7] +
                  *local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
      uVar10 = uVar7 + 1;
      if (uVar10 < uVar6) {
        lVar5 = 1;
        do {
          local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar5] =
               pdVar3[uVar7] * pdVar9[lVar5] + pdVar3[uVar7] * pdVar9[lVar5] +
               local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[lVar5];
          lVar1 = uVar7 + lVar5;
          lVar5 = lVar5 + 1;
        } while (lVar1 + 1U < uVar6);
      }
      pdVar9 = pdVar9 + 1;
      uVar7 = uVar10;
    } while (uVar10 != uVar6 + (uVar6 == 0));
  }
  uVar4 = (uint)((ulong)((long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3);
  uVar7 = (ulong)(uVar4 - 2);
  dVar12 = local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[uVar7 + 1];
  do {
    dVar12 = dVar12 + local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7];
    local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[uVar7] = dVar12;
    bVar11 = uVar7 != 0;
    uVar7 = uVar7 - 1;
  } while (bVar11);
  dVar12 = this->significance_level;
  uVar7 = 0;
  iVar8 = 0;
  if (dVar12 < local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start[1] ||
      dVar12 == local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[1]) {
    uVar6 = 2;
    do {
      iVar8 = (int)uVar7;
      if ((uVar4 & 0x7fffffff) == uVar6) goto LAB_00161cfd;
      uVar7 = uVar6 + 1;
      pdVar2 = local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start + uVar6;
      uVar6 = uVar7;
    } while (dVar12 < *pdVar2 || dVar12 == *pdVar2);
    iVar8 = (int)uVar7 + -2;
  }
LAB_00161cfd:
  operator_delete(local_28.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start);
  return iVar8;
}

Assistant:

int AnyDistributionEdgeCalculator::computeAllowableInsertSizeDiff() {
	// first compute distribution of (absolute) differences of two independently sampled insert lengths
	vector<double> diff_dist(2*insert_size_dist->size(), 0.0);
	for (size_t i=0; i<insert_size_dist->size(); ++i) {
		diff_dist[0] += insert_size_dist->at(i) * insert_size_dist->at(i);
		for (size_t j=i+1; j<insert_size_dist->size(); ++j) {
			diff_dist[j-i] += 2 * (insert_size_dist->at(i) * insert_size_dist->at(j));
		}
	}
	// compute right-cumulative distribution
	for (int i=diff_dist.size()-2; i>=0; --i) {
		diff_dist[i] += diff_dist[i+1];
	}
	// determine largest difference k such that P(diff >= k) >= significance_level
	for (int k=1; k < (int)diff_dist.size(); ++k) {
		if (diff_dist[k] < significance_level) return k-1;
	}
	assert(false);
}